

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

DWORD GetTickCount(void)

{
  ULONGLONG UVar1;
  DWORD retval;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  UVar1 = GetTickCount64();
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (DWORD)UVar1;
}

Assistant:

DWORD
PALAPI
GetTickCount(
         VOID)
{
    DWORD retval = 0;
    PERF_ENTRY(GetTickCount);
    ENTRY("GetTickCount ()\n");

    // Get the 64-bit count from GetTickCount64 and truncate the results.
    retval = (DWORD) GetTickCount64();

    LOGEXIT("GetTickCount returns DWORD %u\n", retval);
    PERF_EXIT(GetTickCount);
    return retval;
}